

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/discretedynamics[P]cyclone/build_O2/_deps/catch2-src/single_include/catch2/catch.hpp:9773:41)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_discretedynamics[P]cyclone_build_O2__deps_catch2_src_single_include_catch2_catch_hpp:9773:41)>
          *this,string *arg)

{
  bool bVar1;
  When WVar2;
  string keypressLc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  BasicResult<Catch::clara::detail::ParseResultType> local_48;
  
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::_M_assign((string *)&temp);
  local_48.m_errorMessage._M_dataplus._M_p = (pointer)&local_48.m_errorMessage.field_2;
  local_48.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.m_type = Ok
  ;
  local_48.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase._12_4_ = 0;
  local_48.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_0018b6d8;
  local_48.m_errorMessage._M_string_length = 0;
  local_48.m_errorMessage.field_2._M_local_buf[0] = '\0';
  toLower(&keypressLc,&temp);
  bVar1 = ::std::operator==(&keypressLc,"never");
  WVar2 = Never;
  if (!bVar1) {
    bVar1 = ::std::operator==(&keypressLc,"start");
    if (bVar1) {
      WVar2 = BeforeStart;
    }
    else {
      bVar1 = ::std::operator==(&keypressLc,"exit");
      if (bVar1) {
        WVar2 = BeforeExit;
      }
      else {
        bVar1 = ::std::operator==(&keypressLc,"both");
        if (!bVar1) {
          ::std::operator+(&local_88,
                           "keypress argument must be one of: never, start, exit or both. \'",&temp)
          ;
          ::std::operator+(&local_68,&local_88,"\' not recognised");
          BasicResult<Catch::clara::detail::ParseResultType>::runtimeError
                    (__return_storage_ptr__,&local_68);
          ::std::__cxx11::string::~string((string *)&local_68);
          ::std::__cxx11::string::~string((string *)&local_88);
          goto LAB_0012f22c;
        }
        WVar2 = BeforeStartAndExit;
      }
    }
  }
  ((this->m_lambda).config)->waitForKeypress = WVar2;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_0018b6d8;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_0012f22c:
  ::std::__cxx11::string::~string((string *)&keypressLc);
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(&local_48);
  ::std::__cxx11::string::~string((string *)&temp);
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }